

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs.c
# Opt level: O1

int unixpathname(char *src,char *dst,int versionp,int genp)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  __uid_t __uid;
  char *lfn_cp;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  int *piVar9;
  passwd *ppVar10;
  char *pcVar11;
  long lVar12;
  char cVar13;
  char *pcVar14;
  char ver2 [16];
  char ver1 [16];
  char name [64];
  char lfname [4096];
  char fbuf1 [4096];
  char fbuf2 [4096];
  char local_3098 [16];
  char local_3088 [16];
  char local_3078 [64];
  char local_3038;
  char acStack_3037 [4091];
  char local_203c [2];
  char local_203a [4097];
  char local_1039 [4105];
  
  iVar3 = strcmp(src,"<");
  if (iVar3 == 0) {
    dst[0] = '/';
    dst[1] = '\0';
    return 1;
  }
  strcpy(&local_3038,src);
  if (versionp != 0) {
    pcVar7 = &local_3038;
    pcVar8 = (char *)0x0;
    while( true ) {
      while (pcVar4 = pcVar7, cVar13 = *pcVar4, cVar13 == '\'') {
        if (pcVar4[1] == '\0') goto LAB_00135f46;
        pcVar7 = pcVar4 + 2;
      }
      if (cVar13 == '\0') break;
      if (cVar13 == ';') {
        pcVar7 = pcVar4 + 1;
        pcVar8 = pcVar4;
      }
      else {
LAB_00135f46:
        pcVar7 = pcVar4 + 1;
      }
    }
    if (pcVar8 != (char *)0x0) {
      if (pcVar8[1] == '\0') {
LAB_00136005:
        *pcVar8 = '\0';
      }
      else {
        pcVar7 = pcVar8 + 1;
        pcVar4 = pcVar7;
        do {
          cVar13 = *pcVar4;
          pcVar4 = pcVar4 + 1;
        } while (0xf5 < (byte)(cVar13 - 0x3aU));
        if (cVar13 == '\0') {
          uVar6 = strtoul(pcVar7,(char **)0x0,10);
          if ((int)uVar6 == 0) goto LAB_00136005;
          sprintf(local_203a + 2,".~%u~",uVar6 & 0xffffffff);
          *pcVar8 = '\0';
        }
        else {
          strcpy(local_203a + 2,pcVar7);
          sVar5 = strlen(local_203a + 2);
          (local_203a + sVar5 + 2)[0] = '~';
          (local_203a + sVar5 + 2)[1] = '\0';
          pcVar8[0] = '.';
          pcVar8[1] = '~';
          pcVar8[2] = '\0';
        }
        strcat(&local_3038,local_203a + 2);
      }
    }
  }
  if (local_3038 == '~') {
    if ((acStack_3037[0] != '\0') && (acStack_3037[0] != '>')) {
      for (lVar12 = 0; (cVar13 = acStack_3037[lVar12], cVar13 != '\0' && (cVar13 != '>'));
          lVar12 = lVar12 + 1) {
        local_3078[lVar12] = cVar13;
      }
      local_3078[lVar12] = '\0';
      alarm(TIMEOUT_TIME);
      piVar9 = __errno_location();
LAB_00136151:
      *piVar9 = 0;
      ppVar10 = getpwnam(local_3078);
      if (ppVar10 == (passwd *)0x0) goto code_r0x00136169;
      alarm(0);
      strcpy(dst,ppVar10->pw_dir);
      pcVar7 = dst;
      do {
        pcVar8 = pcVar7;
        pcVar7 = pcVar8 + 1;
      } while (*pcVar8 != '\0');
      if (pcVar8[-1] != '/') {
        *pcVar8 = '/';
        pcVar8 = pcVar8 + 1;
      }
      pcVar7 = acStack_3037 + (ulong)(acStack_3037[lVar12] == '>') + lVar12;
      goto LAB_00136236;
    }
    alarm(TIMEOUT_TIME);
    piVar9 = __errno_location();
    while( true ) {
      *piVar9 = 0;
      __uid = getuid();
      ppVar10 = getpwuid(__uid);
      if (ppVar10 != (passwd *)0x0) break;
      if (*piVar9 != 4) {
LAB_0013616f:
        alarm(0);
        return 0;
      }
    }
    alarm(0);
    strcpy(dst,ppVar10->pw_dir);
    pcVar7 = dst;
    do {
      pcVar8 = pcVar7;
      pcVar7 = pcVar8 + 1;
    } while (*pcVar8 != '\0');
    if (pcVar8[-1] != '/') {
      *pcVar8 = '/';
      pcVar8 = pcVar8 + 1;
    }
    pcVar7 = acStack_3037;
    if (acStack_3037[0] != '\0') {
      pcVar7 = acStack_3037 + 1;
    }
    goto LAB_00136236;
  }
  if (local_3038 == '.') {
    if (acStack_3037[0] == '\0') {
      pcVar7 = getcwd(dst,0x1000);
      if (pcVar7 == (char *)0x0) {
        return 0;
      }
      pcVar8 = dst;
      do {
        pcVar7 = pcVar8;
        pcVar8 = pcVar7 + 1;
      } while (*pcVar7 != '\0');
      *pcVar7 = '/';
      pcVar7 = acStack_3037;
      goto LAB_00136236;
    }
    if (acStack_3037[0] == '>') {
      pcVar7 = getcwd(dst,0x1000);
      pcVar8 = dst;
      if (pcVar7 == (char *)0x0) {
        return 0;
      }
      do {
        pcVar7 = pcVar8;
        pcVar8 = pcVar7 + 1;
      } while (*pcVar7 != '\0');
      *pcVar7 = '/';
      pcVar7 = acStack_3037 + 1;
      goto LAB_00136236;
    }
    if ((acStack_3037[0] == '.') && ((acStack_3037[1] == '>' || (acStack_3037[1] == '\0')))) {
      pcVar7 = getcwd(dst,0x1000);
      if (pcVar7 == (char *)0x0) {
        return 0;
      }
      pcVar8 = strrchr(dst,0x2f);
      pcVar8 = pcVar8 + 1;
      pcVar7 = acStack_3037 + 2;
      if (acStack_3037[1] == '\0') {
        pcVar7 = acStack_3037 + 1;
      }
      goto LAB_00136236;
    }
  }
  pcVar8 = dst + 1;
  *dst = '/';
  pcVar7 = &local_3038;
LAB_00136236:
  cVar13 = *pcVar7;
  bVar2 = true;
  do {
    if (cVar13 == '\0') {
      *pcVar8 = '\0';
      if (!bVar2 && genp == 0) {
        pcVar8 = local_203a + 2;
        strcpy(pcVar8,&local_3038);
        pcVar4 = local_1039 + 1;
        strcpy(pcVar4,dst);
        separate_version(pcVar8,local_3088,1);
        separate_version(pcVar4,local_3098,1);
        pcVar7 = local_203c;
        do {
          pcVar11 = pcVar7;
          pcVar7 = pcVar11 + 1;
        } while (pcVar11[4] != '\0');
        do {
          pcVar14 = pcVar4;
          pcVar4 = pcVar14 + 1;
        } while (*pcVar14 != '\0');
        if ((pcVar11[3] == '.') &&
           ((pcVar11[2] != '\'' || ((pcVar8 < pcVar7 && (*pcVar7 == '\'')))))) {
          pcVar14[-1] = '\0';
        }
        strcpy(dst,local_1039 + 1);
        if (local_3098[0] != '\0') {
          sVar5 = strlen(dst);
          (dst + sVar5)[0] = '.';
          (dst + sVar5)[1] = '~';
          dst[sVar5 + 2] = '\0';
          strcat(dst,local_3098);
          sVar5 = strlen(dst);
          (dst + sVar5)[0] = '~';
          (dst + sVar5)[1] = '\0';
        }
      }
      return 1;
    }
    if (bVar2) {
      if (cVar13 == '\'') {
        *pcVar8 = pcVar7[1];
        pcVar8 = pcVar8 + 1;
LAB_001362cf:
        pcVar4 = pcVar7 + 2;
        goto LAB_001362de;
      }
      pcVar4 = pcVar7 + 1;
      if (cVar13 == '.') {
        cVar1 = *pcVar4;
        bVar2 = true;
        if (cVar1 != '\0') {
          if (cVar1 == '>') {
            pcVar4 = pcVar7 + 2;
          }
          else {
            if (cVar1 != '.') goto LAB_001362bc;
            cVar13 = pcVar7[2];
            if ((cVar13 != '>') && (cVar13 != '\0')) goto LAB_001362c2;
            pcVar4 = pcVar8;
            if (pcVar8 + -1 != dst) {
              do {
                pcVar8 = pcVar4 + -1;
                pcVar11 = pcVar4 + -2;
                pcVar4 = pcVar8;
              } while (*pcVar11 != '/');
            }
            pcVar4 = pcVar7 + 3;
            if (cVar13 == '\0') {
              pcVar4 = pcVar7 + 2;
            }
          }
        }
      }
      else {
LAB_001362bc:
        *pcVar8 = cVar13;
        pcVar8 = pcVar8 + 1;
LAB_001362c2:
        bVar2 = false;
      }
    }
    else {
      if (cVar13 == '\'') goto LAB_001362cf;
      if (cVar13 == '>') {
        *pcVar8 = '/';
        pcVar8 = pcVar8 + 1;
        bVar2 = true;
        pcVar4 = pcVar7 + 1;
        goto LAB_001362e3;
      }
      pcVar4 = pcVar7 + 1;
      *pcVar8 = cVar13;
      pcVar8 = pcVar8 + 1;
LAB_001362de:
      bVar2 = false;
    }
LAB_001362e3:
    cVar13 = *pcVar4;
    pcVar7 = pcVar4;
  } while( true );
code_r0x00136169:
  if (*piVar9 != 4) goto LAB_0013616f;
  goto LAB_00136151;
}

Assistant:

int unixpathname(char *src, char *dst, int versionp, int genp)
#endif /* DOS */
{
  char *cp, *dp, *np;
  int newdirflg;
  char name[64];
  char lfname[MAXPATHLEN], fbuf1[MAXPATHLEN], fbuf2[MAXPATHLEN];
  char ver1[VERSIONLEN], ver2[VERSIONLEN];
  struct passwd *pwd;

#ifdef DOS
  char *rp;
  int namelen = 0, extlen = 0; /* lengths of name & extension */
  int extensionp = 0;          /* T if we're in the extension */
  int version = 1;             /* version # for this file */
#endif                         /* DOS */

/* If there's a drive letter, it and a colon come first */
#ifdef DOS
  if (drive && (*drive)) {
    *dst++ = *drive;
    *dst++ = DRIVESEP;
  }
#endif /* DOS */

  /*
   * The UNIX root directory is represented as "<" in Xerox Lisp generic
   * file system code.
   */
  if (strcmp(src, "<") == 0) {
    strcpy(dst, DIRSEPSTR);
    return (1);
  }

  /* Copy src to protect it from destructive modification. */
  strcpy(lfname, src);

/*
 * If versionp is specified, we have to deal with the version field first,
 * because the quotation mark which quotes the semicolon might be lost
 * in the course of the following conversion.
 */
#ifdef DOS
  if (versionp) LispVersionToUnixVersion(lfname, version); else version = -1;
#else
  if (versionp) LispVersionToUnixVersion(lfname);
#endif /* DOS */

  cp = lfname;
  dp = dst;

  /*
   * We have to deal with the case in which the pathname is started with
   * the meta character ('.', '~').
   */

  switch (*cp) {
    case '.':
      switch (*(cp + 1)) {
        case '.':
          if (*(cp + 2) == '>' || *(cp + 2) == '\0') {
            /*
             * "..>" or ".." means the parent directory of the
             * user's current working directory.
             */
            if (getcwd(dst, MAXPATHLEN) == 0) return (0);
#ifdef DOS
            dp = max(strrchr(dst, '/'), strrchr(dst, DIRSEP));
#else
            dp = strrchr(dst, '/');
#endif /* DOS */

            dp++;
            if (*(cp + 2) == '\0')
              cp += 2;
            else
              cp += 3;
          } else {
            /* Insert the initial directory delimiter. */
            *dp++ = DIRSEP;
          }
          break;
#ifdef DOS
        case '/':
        case DIRSEP:
#endif
        case '>':
          /* ".>" means the user's current working directory. */
          if (getcwd(dst, MAXPATHLEN) == 0) return (0);
          while (*dp != '\0') dp++;

          *dp++ = DIRSEP;
          cp += 2;
          break;

        case '\0':
          /* "." also means the user's current working directory. */
          if (getcwd(dst, MAXPATHLEN) == 0) return (0);
          while (*dp != '\0') dp++;

          *dp++ = DIRSEP;
          cp++;
          break;

        default:
          /* Insert the initial directory delimiter. */
          *dp++ = DIRSEP;
          break;
      }
      break;
#ifndef DOS
    case '~':
      if (*(cp + 1) == '>' || *(cp + 1) == '\0') {
        /* "~>" or "~" means the user's home directory. */
        TIMEOUT0(pwd = getpwuid(getuid()));
        if (pwd == NULL) return (0);

        strcpy(dst, pwd->pw_dir);
        while (*dp != '\0') dp++;
        if (*(dp - 1) != DIRSEP) {
          /*
           * Usually system administrators specify the users'
           * home directories in the /etc/passwd without
           * the trail directory delimiter.
           */
          *dp++ = DIRSEP;
        }
        if (*(cp + 1) == '\0')
          cp++;
        else
          cp += 2;
      } else {
        /*
         * In this case, we assume some user's home directory
         * is specified in the form "~username".
         */
        for (++cp, np = name; *cp != '\0' && *cp != '>';) *np++ = *cp++;
        *np = '\0';
        TIMEOUT0(pwd = getpwnam(name));
        if (pwd == NULL) return (0);

        strcpy(dst, pwd->pw_dir);
        while (*dp != '\0') dp++;
        if (*(dp - 1) != DIRSEP) {
          /*
           * Usually system administrators specify the users'
           * home directories in the /etc/passwd without
           * the trail directory delimiter.
           */
          *dp++ = DIRSEP;
        }

        if (*cp == '>') cp++;
      }
      break;

#else
    /* For DOS, ignore ~> or ~/ or ~ */
    case '~':
      if (*(cp + 1) == '>' || *(cp + 1) == '\0') {
        /* "~>" or "~" means the user's home directory. */

        *dp++ = DIRSEP;
        if (*(cp + 1) == '\0')
          cp++;
        else
          cp += 2;
      } else {
        /*
         * In this case, we assume some user's home directory
         * is specified in the form "~username".
         */
        for (++cp, np = name; *cp != '\0' && *cp != '>';) *np++ = *cp++;
        *dp++ = DIRSEP;

        if (*cp == '>') cp++;
      }
      break;

#endif /* DOS */
    default:
      *dp++ = '/'; /* Insert the initial directory delimiter. */
      break;
  }

  /*
   * At this point, cp is placed at the point from which the source pathname
   * will be scanned, and dp is placed at the point on dst from which the
   * pathname will be copied.
   */

  newdirflg = 1;
  while (*cp != '\0') {
    if (newdirflg) {
      /*
       * The new directory component starts.  We have to care about
       * the meta characters again.  This time, the tilde character
       * has no special meaning.
       */
      switch (*cp) {
        case '.':
          switch (*(cp + 1)) {
            case '.':
              /* "..>" or ".." */
              if (*(cp + 2) == '>' || *(cp + 2) == '\0') {
                /*
                 * We have to check if we have already
                 * backed to the root directory or not.
                 */
                if ((dp - 1) != dst) {
                  /*
                   * We are not at the root
                   * directory.  Back to the
                   * parent directory.
                   */
                  for (dp -= 2; *dp != '/'; dp--) {}
                  dp++;
                }
                if (*(cp + 2) == '\0')
                  cp += 2;
                else
                  cp += 3;
              } else {
                /*
                 * (IL:DIRECTORY "{DSK}.") is translated
                 * as (IL:DIRECTORY "{DSK}~>.;*").
                 * The Lisp directory is translated as
                 * like "/users/akina/..~*~" by
                 * unixpathname.   Although such
                 * file name representation makes no sense,
                 * to avoid infinite loop, skip the
                 * first period here, as well as down
                 * a newdirflg.
                 */
                cp++;
                newdirflg = 0;
              }
              break;

            case '>':
              /* ".>" */
              cp += 2;
              break;

            case '\0':
              /* "." */
              cp++;
              break;

            default:
              *dp++ = *cp++;
              newdirflg = 0;
              break;
          }
          break;

        case '\'':
          /*
           * The first character of the new directory component
           * is a quotation mark which is the quote character
           * in the Xerox Lisp file naming convention.  Copy the
           * next character and skip the quoted character.
           */
          *dp++ = *(cp + 1);
          cp += 2;
          newdirflg = 0;
          break;

        default:
          *dp++ = *cp++;
          newdirflg = 0;
          break;
      }
    } else {
      switch (*cp) {
#ifdef DOS
        case '/': /* in DOS, must xlate / also. */
#endif            /* DOS */
        case '>':
          /*
           * Xerox Lisp directory delimiter '>' is translated into
           * UNIX one, '/'.
           */
          *dp = DIRSEP;
          dp++;
          cp++;
          newdirflg = 1; /* Turn on the new directory flag. */
#ifdef DOS
          namelen = extlen = 0;
          rp = dp; /* remember where raw filename starts */
#endif             /* DOS */
          break;

        case '\'':
/*
 * The special characters in the Xerox Lisp file naming
 * convention are quoted with the quote character.
 * They are all valid in the UNIX file naming convention.
 * So only we have to do is to skip the quotation mark
 * and copy the next character.
 */
#ifdef DOS
          if (NameValid) *dp++ = *(cp + 1);
          CountNameChars;
#endif /* DOS */
          cp += 2;
          break;
#ifdef DOS
        case '.': /* start of extension, if not already */
          if (!extensionp)
            *dp++ = *cp++;
          else
            cp++;
          extensionp = 1;
          break;
#endif /* DOS */
        default:
          if (NameValid)
            *dp++ = *cp++;
          else
            cp++;
          CountNameChars;
          break;
      }
    }
  }
  *dp = '\0';
  if (!newdirflg && !genp) {
    /*
     * If the last character in dst is a period, it has to be handled
     * specially, because it might be used to specify that src has no
     * extension field.  This case can be distinguished by examining the
     * character just before the period.
     * If the specified pathname is one like "~>..", the last meta character
     * matches this case.  Thus we check newdirflg first so as not to be
     * confused by this case.
     *
     * Only case in which genp is 1 is unixpathname is used to convert
     * a pattern which is used to enumerate directory.  In this case,
     * for the convenience of the pattern matching routines, we don't
     * care about the last period character.
     */
    strcpy(fbuf1, lfname);
    strcpy(fbuf2, dst);
    separate_version(fbuf1, ver1, 1);
    separate_version(fbuf2, ver2, 1);
    for (cp = fbuf1; *cp; cp++) {}
    for (dp = fbuf2; *dp; dp++) {}
    if (*(cp - 1) == '.') {
      if (*(cp - 2) != '\'' || ((cp - 3) > fbuf1 && *(cp - 3) == '\'')) {
        /*
         * The last period is not been quoted.  It is used
         * to specify the no extension case.  We have to
         * omit this period.
         */
        *(dp - 1) = '\0';
      }
    }
#ifdef DOS
    if (version >= 0)
      sprintf(ver2, "%d", version);
    else
      *ver2 = '\0';
#endif /* DOS */
    ConcNameAndVersion(fbuf2, ver2, dst);
  }
  return (1);
}